

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry::
~InodeFileConfig_MountPointMappingEntry(InodeFileConfig_MountPointMappingEntry *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__InodeFileConfig_MountPointMappingEntry_003c7510;
  pcVar1 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar2 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->scan_roots_);
  pcVar1 = (this->mountpoint_)._M_dataplus._M_p;
  paVar2 = &(this->mountpoint_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

InodeFileConfig_MountPointMappingEntry::~InodeFileConfig_MountPointMappingEntry() = default;